

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NetworkUpdateParameters::InternalSwap
          (NetworkUpdateParameters *this,NetworkUpdateParameters *other)

{
  intptr_t iVar1;
  Optimizer *pOVar2;
  Int64Parameter *pIVar3;
  Int64Parameter *pIVar4;
  BoolParameter *pBVar5;
  
  iVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar1;
  google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::InternalSwap
            (&this->losslayers_,&other->losslayers_);
  pOVar2 = this->optimizer_;
  pIVar3 = this->epochs_;
  pIVar4 = other->epochs_;
  this->optimizer_ = other->optimizer_;
  this->epochs_ = pIVar4;
  other->optimizer_ = pOVar2;
  other->epochs_ = pIVar3;
  pBVar5 = this->shuffle_;
  pIVar3 = this->seed_;
  pIVar4 = other->seed_;
  this->shuffle_ = other->shuffle_;
  this->seed_ = pIVar4;
  other->shuffle_ = pBVar5;
  other->seed_ = pIVar3;
  return;
}

Assistant:

void NetworkUpdateParameters::InternalSwap(NetworkUpdateParameters* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  losslayers_.InternalSwap(&other->losslayers_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(NetworkUpdateParameters, seed_)
      + sizeof(NetworkUpdateParameters::seed_)
      - PROTOBUF_FIELD_OFFSET(NetworkUpdateParameters, optimizer_)>(
          reinterpret_cast<char*>(&optimizer_),
          reinterpret_cast<char*>(&other->optimizer_));
}